

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUHal.cpp
# Opt level: O0

bool __thiscall RTIMUHal::HALOpen(RTIMUHal *this)

{
  int iVar1;
  uint local_40;
  undefined1 local_3a;
  undefined1 local_39;
  uint32_t SPISpeed;
  uchar SPIBits;
  uchar SPIMode;
  char buf [32];
  RTIMUHal *this_local;
  
  local_39 = 0;
  local_3a = 8;
  local_40 = this->m_SPISpeed;
  buf._24_8_ = this;
  if ((this->m_busIsI2C & 1U) == 0) {
    if (this->m_SPIBus == 0xff) {
      fprintf(_stderr,"No SPI bus has been set\n");
      return false;
    }
    sprintf((char *)&SPISpeed,"/dev/spidev%d.%d",(ulong)this->m_SPIBus,(ulong)this->m_SPISelect);
    iVar1 = open((char *)&SPISpeed,2);
    this->m_SPI = iVar1;
    if (this->m_SPI < 0) {
      fprintf(_stderr,"Failed to open SPI bus %d, select %d\n",(ulong)this->m_SPIBus,
              (ulong)this->m_SPISelect);
      this->m_SPI = -1;
      return false;
    }
    iVar1 = ioctl(this->m_SPI,0x40016b01,&local_39);
    if (iVar1 < 0) {
      fprintf(_stderr,"Failed to set WR SPI_MODE0 on bus %d",(ulong)this->m_SPIBus);
      close((uint)this->m_SPIBus);
      return false;
    }
    iVar1 = ioctl(this->m_SPI,0x80016b01,&local_39);
    if (iVar1 < 0) {
      fprintf(_stderr,"Failed to set RD SPI_MODE0 on bus %d",(ulong)this->m_SPIBus);
      close((uint)this->m_SPIBus);
      return false;
    }
    iVar1 = ioctl(this->m_SPI,0x40016b03,&local_3a);
    if (iVar1 < 0) {
      fprintf(_stderr,"Failed to set WR 8 bit mode on bus %d",(ulong)this->m_SPIBus);
      close((uint)this->m_SPIBus);
      return false;
    }
    iVar1 = ioctl(this->m_SPI,0x80016b03,&local_3a);
    if (iVar1 < 0) {
      fprintf(_stderr,"Failed to set RD 8 bit mode on bus %d",(ulong)this->m_SPIBus);
      close((uint)this->m_SPIBus);
      return false;
    }
    iVar1 = ioctl(this->m_SPI,0x40046b04,&local_40);
    if (iVar1 < 0) {
      fprintf(_stderr,"Failed to set WR %dHz on bus %d",(ulong)local_40,(ulong)this->m_SPIBus);
      close((uint)this->m_SPIBus);
      return false;
    }
    iVar1 = ioctl(this->m_SPI,0x80046b04,&local_40);
    if (iVar1 < 0) {
      fprintf(_stderr,"Failed to set RD %dHz on bus %d",(ulong)local_40,(ulong)this->m_SPIBus);
      close((uint)this->m_SPIBus);
      return false;
    }
  }
  else {
    if (-1 < this->m_I2C) {
      return true;
    }
    if (this->m_I2CBus == 0xff) {
      fprintf(_stderr,"No I2C bus has been set\n");
      return false;
    }
    sprintf((char *)&SPISpeed,"/dev/i2c-%d",(ulong)this->m_I2CBus);
    iVar1 = open((char *)&SPISpeed,2);
    this->m_I2C = iVar1;
    if (this->m_I2C < 0) {
      fprintf(_stderr,"Failed to open I2C bus %d\n",(ulong)this->m_I2CBus);
      this->m_I2C = -1;
      return false;
    }
  }
  return true;
}

Assistant:

bool RTIMUHal::HALOpen()
{
    char buf[32];
    unsigned char SPIMode = SPI_MODE_0;
    unsigned char SPIBits = 8;
    uint32_t SPISpeed = m_SPISpeed;

    if (m_busIsI2C) {
        if (m_I2C >= 0)
            return true;

        if (m_I2CBus == 255) {
            HAL_ERROR("No I2C bus has been set\n");
            return false;
        }
        sprintf(buf, "/dev/i2c-%d", m_I2CBus);
        m_I2C = open(buf, O_RDWR);
        if (m_I2C < 0) {
            HAL_ERROR1("Failed to open I2C bus %d\n", m_I2CBus);
            m_I2C = -1;
            return false;
        }
    } else {
        if (m_SPIBus == 255) {
            HAL_ERROR("No SPI bus has been set\n");
            return false;
        }

        sprintf(buf, "/dev/spidev%d.%d", m_SPIBus, m_SPISelect);
        m_SPI = open(buf, O_RDWR);
        if (m_SPI < 0) {
            HAL_ERROR2("Failed to open SPI bus %d, select %d\n", m_SPIBus, m_SPISelect);
            m_SPI = -1;
            return false;
        }

        if (ioctl(m_SPI, SPI_IOC_WR_MODE, &SPIMode) < 0) {
            HAL_ERROR1("Failed to set WR SPI_MODE0 on bus %d", m_SPIBus);
            close(m_SPIBus);
            return false;
        }

        if (ioctl(m_SPI, SPI_IOC_RD_MODE, &SPIMode) < 0) {
            HAL_ERROR1("Failed to set RD SPI_MODE0 on bus %d", m_SPIBus);
            close(m_SPIBus);
            return false;
        }

        if (ioctl(m_SPI, SPI_IOC_WR_BITS_PER_WORD, &SPIBits) < 0) {
            HAL_ERROR1("Failed to set WR 8 bit mode on bus %d", m_SPIBus);
            close(m_SPIBus);
            return false;
        }

        if (ioctl(m_SPI, SPI_IOC_RD_BITS_PER_WORD, &SPIBits) < 0) {
            HAL_ERROR1("Failed to set RD 8 bit mode on bus %d", m_SPIBus);
            close(m_SPIBus);
            return false;
        }

        if (ioctl(m_SPI, SPI_IOC_WR_MAX_SPEED_HZ, &SPISpeed) < 0) {
             HAL_ERROR2("Failed to set WR %dHz on bus %d", SPISpeed, m_SPIBus);
             close(m_SPIBus);
             return false;
        }

        if (ioctl(m_SPI, SPI_IOC_RD_MAX_SPEED_HZ, &SPISpeed) < 0) {
             HAL_ERROR2("Failed to set RD %dHz on bus %d", SPISpeed, m_SPIBus);
             close(m_SPIBus);
             return false;
        }
    }
    return true;
}